

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *
__thiscall helics::CommonCore::getHandleInfo(CommonCore *this,InterfaceHandle handle)

{
  BasicHandleInfo *pBVar1;
  shared_lock<std::shared_mutex> local_20;
  
  local_20._M_pm = &(this->handles).m_mutex;
  local_20._M_owns = true;
  std::__shared_mutex_pthread::lock_shared(&(local_20._M_pm)->_M_impl);
  pBVar1 = HandleManager::getHandleInfo(&(this->handles).m_obj,handle.hid);
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_20);
  return (_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)pBVar1;
}

Assistant:

const BasicHandleInfo* CommonCore::getHandleInfo(InterfaceHandle handle) const
{
    return handles.read([handle](auto& hand) { return hand.getHandleInfo(handle.baseValue()); });
}